

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O1

IterateResult __thiscall glcts::SampleShadingRenderCase::iterate(SampleShadingRenderCase *this)

{
  string *sampler;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ChannelOrder CVar2;
  ChannelType CVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  TestLog *pTVar7;
  RenderContext *pRVar8;
  code *pcVar9;
  deUint16 **ppdVar10;
  bool bVar11;
  int iVar12;
  deUint32 dVar13;
  int iVar14;
  undefined4 uVar15;
  uint uVar16;
  int iVar17;
  undefined4 extraout_var;
  TestError *pTVar19;
  char *pcVar20;
  ulong uVar21;
  SampleShadingRenderCase *pSVar22;
  TestContext *this_00;
  int iVar23;
  long lVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  float position_1 [8];
  float position [8];
  GLint maxSamples;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> result;
  GLuint fbo;
  GLuint rbo;
  GLuint fboMs;
  GLuint tex;
  PixelBufferAccess pixels;
  TextureLevel results;
  undefined1 local_308 [8];
  deUint16 **ppdStack_300;
  undefined1 local_2f8 [24];
  int local_2e0;
  string local_2d8;
  int local_2b0;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  undefined1 local_2a8 [8];
  pointer local_2a0;
  undefined1 local_298 [16];
  GLfloat local_288;
  GLfloat local_284;
  ulong local_280;
  GLfloat local_278;
  GLfloat local_274;
  undefined8 local_270;
  string local_260;
  undefined4 local_240;
  undefined4 local_23c;
  value_type local_238;
  string *local_218;
  string local_210;
  undefined4 local_1f0;
  undefined4 local_1ec;
  string *local_1e8;
  TestLog *local_1e0;
  undefined1 local_1d8 [8];
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  int local_1b0;
  pointer local_1a8;
  pointer pbStack_1a0;
  int local_198;
  string *local_190;
  PrimitiveType local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  pointer pbStack_150;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [32];
  TextureFormat *local_108;
  ShaderProgram local_100;
  long lVar18;
  
  pTVar7 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar12);
  if ((this->m_glslVersion == GLSL_VERSION_310_ES) &&
     (bVar11 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_sample_shading")
     , !bVar11)) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar20 = "GL_OES_sample_shading";
LAB_00bf3f1f:
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_NOT_SUPPORTED,pcVar20);
    return STOP;
  }
  if (((this->m_extension)._M_string_length != 0) &&
     (bVar11 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          (this->m_extension)._M_dataplus._M_p), !bVar11)) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar20 = (this->m_extension)._M_dataplus._M_p;
    goto LAB_00bf3f1f;
  }
  this->m_pGLMinSampleShading = *(glMinSampleShadingFunc *)(lVar18 + 0xdc8);
  local_2b0 = 0;
  CVar2 = (this->m_texFormat).order;
  CVar3 = (this->m_texFormat).type;
  if ((CVar3 != HALF_FLOAT || CVar2 != RGBA) &&
      ((CVar2 != R && CVar2 != RG) && CVar2 != RGBA || CVar3 != FLOAT)) {
    uVar15 = 0x8d57;
    if (CVar3 == UNSIGNED_INT8) {
      uVar15 = 0x9110;
    }
    if (CVar3 == SIGNED_INT8) {
      uVar15 = 0x9110;
    }
    (**(code **)(lVar18 + 0x868))(uVar15,&local_2b0);
  }
  else {
    (**(code **)(lVar18 + 0x880))(0x9100,this->m_internalFormat,0x80a9,1,&local_2b0);
    if (local_2b0 == 0) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar20 = "Multisample is not supported on this format";
      goto LAB_00bf3f1f;
    }
  }
  iVar12 = 4;
  if (local_2b0 < 4) {
    iVar12 = local_2b0;
  }
  local_1e0 = pTVar7;
  (**(code **)(lVar18 + 0x6f8))(1,&local_1ec);
  (**(code **)(lVar18 + 0xb8))(0x9100,local_1ec);
  (**(code **)(lVar18 + 0x1390))(0x9100,iVar12,this->m_internalFormat,0x10,0x10);
  (**(code **)(lVar18 + 0x6d0))(1,&local_1f0);
  (**(code **)(lVar18 + 0x78))(0x8d40,local_1f0);
  (**(code **)(lVar18 + 0x6a0))(0x8d40,0x8ce0,0x9100,local_1ec,0);
  (**(code **)(lVar18 + 0x1a00))(0,0,0x10,0x10);
  (*this->m_pGLMinSampleShading)(this->m_sampleShading);
  (**(code **)(lVar18 + 0x5e0))(0x8c36);
  pRVar8 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,
             "${VERSION_DECL}\nin highp vec2 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n   v_color = a_color;\n}\n"
             ,"");
  sampler = &this->m_sampler;
  local_218 = &this->m_outType;
  specializeVersion((string *)local_308,&local_2d8,this->m_glslVersion,sampler,local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2a8,(char *)local_308,(allocator<char> *)&local_23c);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "${VERSION_DECL}\nin highp vec4 v_color;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main (void)\n{\n   o_color = ${OUT_TYPE}(v_color.x, v_color.y, 0.0, 0.0);\n}\n"
             ,"");
  specializeVersion(&local_260,&local_210,this->m_glslVersion,sampler,local_218);
  local_1e8 = sampler;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,local_260._M_dataplus._M_p,(allocator<char> *)&local_240);
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,(value_type *)local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c0,&local_238);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar8,(ProgramSources *)local_1d8);
  local_108 = &this->m_texFormat;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  paVar1 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pTVar7 = local_1e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8 != (undefined1  [8])local_298) {
    operator_delete((void *)local_2a8,local_298._0_8_ + 1);
  }
  if (local_308 != (undefined1  [8])local_2f8) {
    operator_delete((void *)local_308,local_2f8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(pTVar7,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
               ,0x135);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_2d8.field_2._M_allocated_capacity = 0xbf8000003f800000;
  local_2d8.field_2._8_8_ = &DAT_3f8000003f800000;
  local_2d8._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_2d8._M_string_length = 0x3f800000bf800000;
  local_284 = this->m_min;
  local_2a8._4_4_ = local_284;
  local_2a8._0_4_ = local_284;
  local_2a0 = (pointer)0x3f80000000000000;
  local_288 = this->m_max;
  local_298._0_4_ = this->m_min;
  local_298._4_4_ = this->m_max;
  local_298._8_8_ = 0x3f80000000000000;
  local_280 = 0x3f80000000000000;
  local_270 = 0x3f80000000000000;
  local_278 = local_288;
  local_274 = local_288;
  (**(code **)(lVar18 + 0x1680))(local_100.m_program.m_program);
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"a_position","");
  local_308._0_4_ = 1;
  ppdVar10 = (deUint16 **)(local_2f8 + 8);
  ppdStack_300 = ppdVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ppdStack_300,local_238._M_dataplus._M_p,
             local_238._M_dataplus._M_p + local_238._M_string_length);
  local_2e0 = 0;
  local_1d8._0_4_ = local_308._0_4_;
  local_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,ppdStack_300,local_2f8._0_8_ + (long)ppdStack_300);
  local_1b0 = local_2e0;
  local_1a8 = (pointer)0x8;
  pbStack_1a0 = (pointer)0x400000002;
  local_198 = 0;
  local_190 = &local_2d8;
  if (ppdStack_300 != ppdVar10) {
    operator_delete(ppdStack_300,local_2f8._8_8_ + 1);
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"a_color","");
  local_308._0_4_ = 1;
  ppdStack_300 = ppdVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ppdStack_300,local_260._M_dataplus._M_p,
             local_260._M_dataplus._M_p + local_260._M_string_length);
  local_2e0 = 0;
  local_188 = local_308._0_4_;
  pbVar25 = &local_170;
  local_180[0] = pbVar25;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,ppdStack_300,local_2f8._0_8_ + (long)ppdStack_300);
  local_170.field_2._M_allocated_capacity._0_4_ = local_2e0;
  local_170.field_2._8_8_ = (pointer)0x8;
  pbStack_150 = (pointer)0x400000004;
  local_148.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_148.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2a8;
  if (ppdStack_300 != ppdVar10) {
    operator_delete(ppdStack_300,local_2f8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_308 = (undefined1  [8])&DAT_600000001;
  ppdStack_300 = (deUint16 **)CONCAT44(ppdStack_300._4_4_,1);
  local_2f8._0_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,2,
            (VertexArrayBinding *)local_1d8,(PrimitiveList *)local_308,(DrawUtilCallback *)0x0);
  dVar13 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar13,"Draw quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                  ,0x147);
  lVar24 = -0xa0;
  do {
    if (pbVar25 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        pbVar25[-1].field_2._M_allocated_capacity) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pbVar25[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar25->_M_dataplus)._M_p + 1));
    }
    pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pbVar25[-3].field_2;
    lVar24 = lVar24 + 0x50;
  } while (lVar24 != 0);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  (*this->m_pGLMinSampleShading)(0.0);
  (**(code **)(lVar18 + 0x4e8))(0x8c36);
  pcVar9 = *(code **)(lVar18 + 0x78);
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar9)(0x8d40,iVar14);
  (**(code **)(lVar18 + 0x440))(1,&local_1f0);
  iVar14 = iVar12 << 4;
  (**(code **)(lVar18 + 0x6e8))(1,&local_23c);
  (**(code **)(lVar18 + 0xa0))(0x8d41,local_23c);
  (**(code **)(lVar18 + 0x1238))(0x8d41,this->m_internalFormat,iVar14,0x10);
  (**(code **)(lVar18 + 0x6d0))(1,&local_240);
  (**(code **)(lVar18 + 0x78))(0x8d40,local_240);
  (**(code **)(lVar18 + 0x688))(0x8d40,0x8ce0,0x8d41,local_23c);
  (**(code **)(lVar18 + 0x1a00))(0,0,iVar14,0x10);
  pRVar8 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,
             "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main(void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,"");
  specializeVersion((string *)local_308,&local_2d8,this->m_glslVersion,local_1e8,local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2a8,(char *)local_308,&local_2a9);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "${VERSION_DECL}\nuniform highp ${SAMPLER} u_tex;\nuniform int u_samples;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main(void)\n{\n   ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n   int sampleId = int(gl_FragCoord.x) % u_samples;\n   o_color = texelFetch(u_tex, coord, sampleId);\n}\n"
             ,"");
  specializeVersion(&local_260,&local_210,this->m_glslVersion,local_1e8,local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,local_260._M_dataplus._M_p,&local_2aa);
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,(value_type *)local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c0,&local_238);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar8,(ProgramSources *)local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pTVar7 = local_1e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8 != (undefined1  [8])local_298) {
    operator_delete((void *)local_2a8,local_298._0_8_ + 1);
  }
  if (local_308 != (undefined1  [8])local_2f8) {
    operator_delete((void *)local_308,local_2f8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(pTVar7,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
               ,0x175);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_2f8._0_8_ = 0xbf8000003f800000;
  local_2f8._8_8_ = &DAT_3f8000003f800000;
  local_308 = (undefined1  [8])0xbf800000bf800000;
  ppdStack_300 = (deUint16 **)0x3f800000bf800000;
  (**(code **)(lVar18 + 0x1680))(local_100.m_program.m_program);
  pcVar9 = *(code **)(lVar18 + 0x14f0);
  uVar15 = (**(code **)(lVar18 + 0xb48))(local_100.m_program.m_program,"u_samples");
  (*pcVar9)(uVar15,iVar12);
  pcVar9 = *(code **)(lVar18 + 0x14f0);
  uVar15 = (**(code **)(lVar18 + 0xb48))(local_100.m_program.m_program,"u_tex");
  (*pcVar9)(uVar15,0);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"a_position","");
  local_2a8._0_4_ = 1;
  local_2a0 = (pointer)(local_298 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  local_280 = local_280 & 0xffffffff00000000;
  local_1d8._0_4_ = local_2a8._0_4_;
  local_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_2a0,
             (undefined1 *)((long)local_2a0->m_data + local_298._0_8_));
  local_1b0 = (int)local_280;
  local_1a8 = (pointer)0x8;
  pbStack_1a0 = (pointer)0x400000002;
  local_198 = 0;
  local_190 = (string *)local_308;
  if (local_2a0 != (pointer)(local_298 + 8)) {
    operator_delete(local_2a0,local_298._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  local_2a8 = (undefined1  [8])&DAT_600000001;
  local_2a0 = (pointer)CONCAT44(local_2a0._4_4_,1);
  local_298._0_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
            (VertexArrayBinding *)local_1d8,(PrimitiveList *)local_2a8,(DrawUtilCallback *)0x0);
  dVar13 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar13,"Draw quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                  ,0x186);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != &local_1c0) {
    operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
  }
  glu::ShaderProgram::~ShaderProgram(&local_100);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&local_100,local_108,iVar14,0x10,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,(TextureLevel *)&local_100);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,
             (long)((int)local_1d0._M_p * local_1d0._M_p._4_4_),(allocator_type *)local_308);
  if (local_1d8._4_4_ == UNSIGNED_INT8) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_308,
               (long)(local_1d0._M_p._4_4_ * (int)local_1d0._M_p * 4),(allocator_type *)&local_2d8);
    pSVar22 = (SampleShadingRenderCase *)0x0;
    (**(code **)(lVar18 + 0x1220))
              (0,0,(ulong)local_1d0._M_p & 0xffffffff,local_1d0._M_p._4_4_,0x8d99,0x1405,local_308);
    if ((undefined1  [8])ppdStack_300 != local_308) {
      uVar16 = 4;
      uVar21 = 0;
      do {
        uVar4 = *(uint *)((long)local_308 + (ulong)(uVar16 - 3) * 4);
        uVar5 = *(uint *)((long)local_308 + (ulong)(uVar16 - 2) * 4);
        uVar6 = *(uint *)((long)local_308 + (ulong)(uVar16 - 1) * 4);
        lVar24 = (ulong)(uVar16 - 4 >> 2) * 0x10;
        *(float *)((long)local_2a8 + lVar24) = (float)*(uint *)((long)local_308 + uVar21 * 4);
        *(float *)((long)local_2a8 + lVar24 + 4) = (float)uVar4;
        *(float *)((long)local_2a8 + lVar24 + 8) = (float)uVar5;
        *(float *)((long)local_2a8 + lVar24 + 0xc) = (float)uVar6;
        uVar21 = (ulong)uVar16;
        uVar16 = uVar16 + 4;
      } while (uVar21 < (ulong)((long)ppdStack_300 - (long)local_308 >> 2));
    }
    iVar14 = countUniquePixels(pSVar22,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        *)local_2a8);
  }
  else {
    if (local_1d8._4_4_ != SIGNED_INT8) {
      pSVar22 = (SampleShadingRenderCase *)((this->super_TestCase).m_context)->m_renderCtx;
      glu::readPixels((RenderContext *)pSVar22,0,0,(PixelBufferAccess *)local_1d8);
      iVar14 = countUniquePixels(pSVar22,(ConstPixelBufferAccess *)local_1d8);
      goto LAB_00bf4058;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_308,
               (long)(local_1d0._M_p._4_4_ * (int)local_1d0._M_p * 4),(allocator_type *)&local_2d8);
    pSVar22 = (SampleShadingRenderCase *)0x0;
    (**(code **)(lVar18 + 0x1220))
              (0,0,(ulong)local_1d0._M_p & 0xffffffff,local_1d0._M_p._4_4_,0x8d99,0x1404,local_308);
    if ((undefined1  [8])ppdStack_300 != local_308) {
      uVar16 = 4;
      uVar21 = 0;
      do {
        iVar14 = *(int *)((long)local_308 + (ulong)(uVar16 - 3) * 4);
        iVar17 = *(int *)((long)local_308 + (ulong)(uVar16 - 2) * 4);
        iVar23 = *(int *)((long)local_308 + (ulong)(uVar16 - 1) * 4);
        lVar24 = (ulong)(uVar16 - 4 >> 2) * 0x10;
        *(float *)((long)local_2a8 + lVar24) = (float)*(int *)((long)local_308 + uVar21 * 4);
        *(float *)((long)local_2a8 + lVar24 + 4) = (float)iVar14;
        *(float *)((long)local_2a8 + lVar24 + 8) = (float)iVar17;
        *(float *)((long)local_2a8 + lVar24 + 0xc) = (float)iVar23;
        uVar21 = (ulong)uVar16;
        uVar16 = uVar16 + 4;
      } while (uVar21 < (ulong)((long)ppdStack_300 - (long)local_308 >> 2));
    }
    iVar14 = countUniquePixels(pSVar22,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        *)local_2a8);
  }
  if (local_308 != (undefined1  [8])0x0) {
    operator_delete((void *)local_308,local_2f8._0_8_ - (long)local_308);
  }
LAB_00bf4058:
  iVar17 = (int)((float)iVar12 * this->m_sampleShading);
  if (iVar17 < iVar12) {
    iVar12 = iVar17;
  }
  iVar23 = 0x100;
  if (0 < iVar17) {
    iVar23 = iVar12 << 8;
  }
  pcVar9 = *(code **)(lVar18 + 0x78);
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar9)(0x8d40,iVar12);
  (**(code **)(lVar18 + 0x440))(1,&local_240);
  (**(code **)(lVar18 + 0xa0))(0x8d41,0);
  (**(code **)(lVar18 + 0x460))(1,&local_23c);
  (**(code **)(lVar18 + 0xb8))(0x9100,0);
  (**(code **)(lVar18 + 0x480))(1,&local_1ec);
  pcVar20 = "Pass";
  if (iVar14 < iVar23) {
    pcVar20 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar14 < iVar23),
             pcVar20);
  if (local_2a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2a8,local_298._0_8_ - (long)local_2a8);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&local_100);
  return STOP;
}

Assistant:

SampleShadingRenderCase::IterateResult SampleShadingRenderCase::iterate()
{
	TestLog&			  log  = m_testCtx.getLog();
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_shading"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_shading");
		return STOP;
	}
	if (!m_extension.empty() && !m_context.getContextInfo().isExtensionSupported(m_extension.c_str()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, m_extension.c_str());
		return STOP;
	}

	m_pGLMinSampleShading = gl.minSampleShading;

	GLint maxSamples = 0;
	if (((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RG)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::R)) ||
		((m_texFormat.type == tcu::TextureFormat::HALF_FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)))
	{
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, m_internalFormat, GL_SAMPLES, 1, &maxSamples);
		if (maxSamples == 0)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Multisample is not supported on this format");
			return STOP;
		}
	}
	else if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			 m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
	}
	else
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
	}
	GLint samples = de::min<GLint>(maxSamples, MAX_SAMPLES);

	GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, tex);
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, m_internalFormat, WIDTH, HEIGHT, GL_FALSE);

	GLuint fboMs;
	gl.genFramebuffers(1, &fboMs);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fboMs);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, tex, 0);
	gl.viewport(0, 0, WIDTH, HEIGHT);

	m_pGLMinSampleShading(m_sampleShading);
	gl.enable(GL_SAMPLE_SHADING_OES);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	{
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "in highp vec4 a_color;\n"
								 "out highp vec4 v_color;\n"
								 "void main (void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "   v_color = a_color;\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "in highp vec4 v_color;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main (void)\n"
								 "{\n"
								 "   o_color = ${OUT_TYPE}(v_color.x, v_color.y, 0.0, 0.0);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		const float position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};
		const float color[] = {
			m_min, m_min, 0.0f, 1.0f, m_min, m_max, 0.0f, 1.0f, m_max, m_min, 0.0f, 1.0f, m_max, m_max, 0.0f, 1.0f,
		};

		gl.useProgram(program.getProgram());

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]), glu::va::Float("a_color", 4, 4, 0, &color[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}
	m_pGLMinSampleShading(0.0f);
	gl.disable(GL_SAMPLE_SHADING_OES);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fboMs);

	GLsizei width = WIDTH * samples;

	GLuint rbo;
	gl.genRenderbuffers(1, &rbo);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, width, HEIGHT);

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
	gl.viewport(0, 0, width, HEIGHT);

	{
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main(void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "uniform highp ${SAMPLER} u_tex;\n"
								 "uniform int u_samples;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main(void)\n"
								 "{\n"
								 "   ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n"
								 "   int sampleId = int(gl_FragCoord.x) % u_samples;\n"
								 "   o_color = texelFetch(u_tex, coord, sampleId);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_samples"), samples);
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 0);

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	tcu::TextureLevel	  results(m_texFormat, width, HEIGHT);
	tcu::PixelBufferAccess pixels = results.getAccess();
	std::vector<tcu::Vec4> result(pixels.getHeight() * pixels.getWidth());
	int					   uniquePixels;

	if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8)
	{
		std::vector<GLint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
		uniquePixels = countUniquePixels(result);
	}
	else if (pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		std::vector<GLuint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
		uniquePixels = countUniquePixels(result);
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, pixels);
		uniquePixels = countUniquePixels(pixels);
	}
	int expectedUnique = WIDTH * HEIGHT * (de::clamp(int(float(samples) * m_sampleShading), 1, samples));
	if (uniquePixels < expectedUnique)
	{
		isOk = false;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.deleteRenderbuffers(1, &rbo);

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
	gl.deleteTextures(1, &tex);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}